

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

void align_limit_to_full_utf8_characters(char *from,char **fromLimRef)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar2 = *fromLimRef;
  pcVar3 = pcVar2;
  if (from < pcVar2) {
    lVar4 = 0;
    do {
      bVar1 = pcVar2[-1];
      if ((bVar1 & 0xf8) == 0xf0) {
        if (lVar4 - 3U < 0xfffffffffffffffc) {
          pcVar3 = pcVar2 + 3;
          break;
        }
LAB_004d7797:
        lVar4 = 0;
      }
      else {
        if ((bVar1 & 0xf0) == 0xe0) {
          if (0xfffffffffffffffc < lVar4 - 2U) goto LAB_004d7797;
          pcVar3 = pcVar2 + 2;
          break;
        }
        if ((bVar1 & 0xe0) == 0xc0) {
          if (0xfffffffffffffffd < lVar4 - 1U) goto LAB_004d7797;
          pcVar3 = pcVar2 + 1;
          break;
        }
        pcVar3 = pcVar2;
        if (-1 < (char)bVar1) break;
      }
      pcVar2 = pcVar2 + -1;
      lVar4 = lVar4 + 1;
      pcVar3 = from;
    } while (from < pcVar2);
  }
  *fromLimRef = pcVar3;
  return;
}

Assistant:

void
align_limit_to_full_utf8_characters(const char * from, const char ** fromLimRef)
{
  const char * fromLim = *fromLimRef;
  size_t walked = 0;
  for (; fromLim > from; fromLim--, walked++) {
    const unsigned char prev = (unsigned char)fromLim[-1];
    if ((prev & 0xf8u) == 0xf0u) { /* 4-byte character, lead by 0b11110xxx byte */
      if (walked + 1 >= 4) {
        fromLim += 4 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0xf0u) == 0xe0u) { /* 3-byte character, lead by 0b1110xxxx byte */
      if (walked + 1 >= 3) {
        fromLim += 3 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0xe0u) == 0xc0u) { /* 2-byte character, lead by 0b110xxxxx byte */
      if (walked + 1 >= 2) {
        fromLim += 2 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0x80u) == 0x00u) { /* 1-byte character, matching 0b0xxxxxxx */
      break;
    }
  }
  *fromLimRef = fromLim;
}